

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O2

void * __thiscall
LdConfigDirWrapper::getFieldPtr(LdConfigDirWrapper *this,size_t fId,size_t subField)

{
  Executable *pEVar1;
  int iVar2;
  offset_t oVar3;
  bufsize_t bVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar2 = (*(((this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
              super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer
            [0xb])();
  oVar3 = _getFieldDelta(iVar2 == 0x20,fId);
  if (oVar3 != 0xffffffffffffffff) {
    bVar4 = getHdrDefinedSize(this);
    if (oVar3 < bVar4) {
      pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               super_ExeElementWrapper.m_Exe;
      iVar2 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x11])
                        (this);
      iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[7])
                        (pEVar1,oVar3 + CONCAT44(extraout_var,iVar2),1,0);
      return (void *)CONCAT44(extraout_var_00,iVar2);
    }
  }
  return (void *)0x0;
}

Assistant:

void* LdConfigDirWrapper::getFieldPtr(size_t fId, size_t subField)
{
    const bool is32b = (m_Exe->getBitMode() == Executable::BITS_32) ? true : false;
    
    offset_t fieldDelta = _getFieldDelta(is32b, fId);
    if (fieldDelta != INVALID_ADDR) {
        const offset_t hdrSize = this->getHdrDefinedSize();
        if (fieldDelta >= hdrSize) {
            return NULL;
        }
        return m_Exe->getContentAt(this->getOffset() + fieldDelta, 1);
    }
    return NULL;
}